

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall
pbrt::BilinearPatchMesh::BilinearPatchMesh
          (BilinearPatchMesh *this,Transform *renderFromObject,bool reverseOrientation,
          vector<int,_std::allocator<int>_> *indices,
          vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *P,
          vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *N,
          vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> UV,
          vector<int,_std::allocator<int>_> fIndices,PiecewiseConstant2D *imageDist)

{
  undefined8 uVar1;
  pointer pPVar2;
  Tuple3<pbrt::Normal3,_float> *pTVar3;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *buf;
  bool bVar4;
  ulong uVar5;
  int *piVar6;
  Point3<float> *pPVar7;
  Point2<float> *pPVar8;
  Normal3<float> *pNVar9;
  ulong uVar10;
  int iVar11;
  Point3f *p;
  pointer p_00;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *__range1;
  iterator __begin2;
  Tuple3<pbrt::Normal3,_float> *this_00;
  long in_FS_OFFSET;
  undefined1 auVar12 [32];
  undefined1 auVar14 [56];
  undefined1 auVar13 [64];
  Point3<float> PVar15;
  Normal3<float> NVar16;
  int vb;
  size_type va;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> *local_38;
  
  this->reverseOrientation = reverseOrientation;
  local_38 = N;
  bVar4 = Transform::SwapsHandedness(renderFromObject);
  this->transformSwapsHandedness = bVar4;
  uVar10 = (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 2;
  iVar11 = (int)(uVar10 >> 2);
  this->nPatches = iVar11;
  uVar5 = ((long)(P->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(P->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
                _M_impl.super__Vector_impl_data._M_start) / 0xc;
  va = uVar10 & 3;
  this->nVertices = (int)uVar5;
  auVar12 = ZEXT1632(ZEXT816(0) << 0x40);
  this->vertexIndices = (int *)auVar12._0_8_;
  this->p = (Point3f *)auVar12._8_8_;
  this->n = (Normal3f *)auVar12._16_8_;
  this->uv = (Point2f *)auVar12._24_8_;
  this->faceIndices = (int *)0x0;
  this->imageDistribution =
       (PiecewiseConstant2D *)
       UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  vb = 0;
  if ((uVar10 & 3) != 0) {
    LogFatal<char_const(&)[21],char_const(&)[2],char_const(&)[21],unsigned_long&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
               ,0xa9,"Check failed: %s == %s with %s = %s, %s = %s",
               (char (*) [21])"(indices.size() % 4)",(char (*) [2])0x2cf1ae5,
               (char (*) [21])"(indices.size() % 4)",&va,(char (*) [2])0x2cf1ae5,&vb);
  }
  *(long *)(in_FS_OFFSET + -800) = *(long *)(in_FS_OFFSET + -800) + 1;
  vb = 0x7fffffff;
  *(long *)(in_FS_OFFSET + -0x318) = *(long *)(in_FS_OFFSET + -0x318) + (long)iVar11;
  if ((uVar5 & 0xffffffff80000000) == 0) {
    vb = 0x7fffffff;
    va = uVar10;
    if ((uVar10 & 0xffffffff80000000) != 0) {
      LogFatal<char_const(&)[15],char_const(&)[32],char_const(&)[15],unsigned_long&,char_const(&)[32],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                 ,0xb0,"Check failed: %s <= %s with %s = %s, %s = %s",
                 (char (*) [15])"indices.size()",(char (*) [32])"std::numeric_limits<int>::max()",
                 (char (*) [15])"indices.size()",&va,
                 (char (*) [32])"std::numeric_limits<int>::max()",&vb);
    }
    auVar13 = ZEXT1664(ZEXT816(0) << 0x40);
    piVar6 = BufferCache<int>::LookupOrAdd(intBufferCache,indices);
    this->vertexIndices = piVar6;
    *(long *)(in_FS_OFFSET + -0x310) = *(long *)(in_FS_OFFSET + -0x310) + 0x40;
    pPVar2 = (P->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (p_00 = (P->super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>).
                _M_impl.super__Vector_impl_data._M_start; auVar14 = auVar13._8_56_, p_00 != pPVar2;
        p_00 = p_00 + 1) {
      PVar15 = Transform::operator()(renderFromObject,p_00);
      auVar13._0_8_ = PVar15.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar13._8_56_ = auVar14;
      uVar1 = vmovlps_avx(auVar13._0_16_);
      (p_00->super_Tuple3<pbrt::Point3,_float>).x = (float)(int)uVar1;
      (p_00->super_Tuple3<pbrt::Point3,_float>).y = (float)(int)((ulong)uVar1 >> 0x20);
      (p_00->super_Tuple3<pbrt::Point3,_float>).z = PVar15.super_Tuple3<pbrt::Point3,_float>.z;
    }
    pPVar7 = BufferCache<pbrt::Point3<float>_>::LookupOrAdd(point3BufferCache,P);
    buf = local_38;
    this->p = pPVar7;
    if ((UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
         super__Vector_impl_data._M_start)->super_Tuple2<pbrt::Point2,_float> !=
        UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
        super__Vector_impl_data._M_start[1].super_Tuple2<pbrt::Point2,_float>) {
      vb = this->nVertices;
      va = (long)UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[1].super_Tuple2<pbrt::Point2,_float> -
           (long)(UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->super_Tuple2<pbrt::Point2,_float> >> 3;
      if (va != (long)vb) {
        LogFatal<char_const(&)[10],char_const(&)[10],char_const(&)[10],int&,char_const(&)[10],unsigned_long&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                   ,0xbd,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [10])"nVertices",
                   (char (*) [10])"UV.size()",(char (*) [10])"nVertices",&vb,
                   (char (*) [10])"UV.size()",&va);
      }
      pPVar8 = BufferCache<pbrt::Point2<float>_>::LookupOrAdd
                         (point2BufferCache,
                          (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                          UV.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      this->uv = pPVar8;
    }
    this_00 = &((buf->
                super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>).
                _M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Normal3,_float>;
    pTVar3 = &((buf->
               super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>).
               _M_impl.super__Vector_impl_data._M_finish)->super_Tuple3<pbrt::Normal3,_float>;
    if (this_00 != pTVar3) {
      vb = this->nVertices;
      va = ((long)pTVar3 - (long)this_00) / 0xc;
      if (va != (long)vb) {
        LogFatal<char_const(&)[10],char_const(&)[9],char_const(&)[10],int&,char_const(&)[9],unsigned_long&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                   ,0xc1,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [10])"nVertices",
                   (char (*) [9])"N.size()",(char (*) [10])"nVertices",&vb,(char (*) [9])"N.size()",
                   &va);
      }
      for (; auVar14 = auVar13._8_56_, this_00 != pTVar3; this_00 = this_00 + 1) {
        NVar16 = Transform::operator()(renderFromObject,(Normal3<float> *)this_00);
        auVar13._0_8_ = NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar13._8_56_ = auVar14;
        uVar1 = vmovlps_avx(auVar13._0_16_);
        this_00->x = (float)(int)uVar1;
        this_00->y = (float)(int)((ulong)uVar1 >> 0x20);
        this_00->z = NVar16.super_Tuple3<pbrt::Normal3,_float>.z;
        if (reverseOrientation) {
          NVar16 = Tuple3<pbrt::Normal3,_float>::operator-(this_00);
          auVar13._0_8_ = NVar16.super_Tuple3<pbrt::Normal3,_float>._0_8_;
          auVar13._8_56_ = auVar14;
          uVar1 = vmovlps_avx(auVar13._0_16_);
          this_00->x = (float)(int)uVar1;
          this_00->y = (float)(int)((ulong)uVar1 >> 0x20);
          this_00->z = NVar16.super_Tuple3<pbrt::Normal3,_float>.z;
        }
      }
      pNVar9 = BufferCache<pbrt::Normal3<float>_>::LookupOrAdd(normal3BufferCache,buf);
      this->n = pNVar9;
    }
    if ((UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish)->super_Tuple2<pbrt::Point2,_float> !=
        UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish[1].super_Tuple2<pbrt::Point2,_float>) {
      vb = this->nPatches;
      va = (long)UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish[1].super_Tuple2<pbrt::Point2,_float> -
           (long)(UV.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish)->super_Tuple2<pbrt::Point2,_float> >> 2
      ;
      if (va != (long)vb) {
        LogFatal<char_const(&)[9],char_const(&)[16],char_const(&)[9],int&,char_const(&)[16],unsigned_long&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
                   ,0xcb,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])"nPatches",
                   (char (*) [16])"fIndices.size()",(char (*) [9])"nPatches",&vb,
                   (char (*) [16])"fIndices.size()",&va);
      }
      piVar6 = BufferCache<int>::LookupOrAdd
                         (intBufferCache,
                          (vector<int,_std::allocator<int>_> *)
                          UV.
                          super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      this->faceIndices = piVar6;
    }
    return;
  }
  va = uVar5;
  LogFatal<char_const(&)[9],char_const(&)[32],char_const(&)[9],unsigned_long&,char_const(&)[32],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mesh.cpp"
             ,0xaf,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [9])"P.size()",
             (char (*) [32])"std::numeric_limits<int>::max()",(char (*) [9])"P.size()",&va,
             (char (*) [32])"std::numeric_limits<int>::max()",&vb);
}

Assistant:

BilinearPatchMesh::BilinearPatchMesh(const Transform &renderFromObject,
                                     bool reverseOrientation, std::vector<int> indices,
                                     std::vector<Point3f> P, std::vector<Normal3f> N,
                                     std::vector<Point2f> UV, std::vector<int> fIndices,
                                     PiecewiseConstant2D *imageDist)
    : reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject.SwapsHandedness()),
      nPatches(indices.size() / 4),
      nVertices(P.size()),
      imageDistribution(std::move(imageDist)) {
    CHECK_EQ((indices.size() % 4), 0);
    ++nBilinearMeshes;
    nBlps += nPatches;

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(P.size(), std::numeric_limits<int>::max());
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());

    vertexIndices = intBufferCache->LookupOrAdd(indices);

    blpBytes += sizeof(*this);

    // Transform mesh vertices to world space
    for (Point3f &p : P)
        p = renderFromObject(p);
    p = point3BufferCache->LookupOrAdd(P);

    // Copy _UV_ and _N_ vertex data, if present
    if (!UV.empty()) {
        CHECK_EQ(nVertices, UV.size());
        uv = point2BufferCache->LookupOrAdd(UV);
    }
    if (!N.empty()) {
        CHECK_EQ(nVertices, N.size());
        for (Normal3f &n : N) {
            n = renderFromObject(n);
            if (reverseOrientation)
                n = -n;
        }
        n = normal3BufferCache->LookupOrAdd(N);
    }

    if (!fIndices.empty()) {
        CHECK_EQ(nPatches, fIndices.size());
        faceIndices = intBufferCache->LookupOrAdd(fIndices);
    }
}